

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_Extensions_Test::TestBody
          (GeneratedMessageReflectionSwapTest_Extensions_Test *this)

{
  Reflection *this_00;
  Message *in_RCX;
  TestAllExtensions lhs;
  TestAllExtensions rhs;
  undefined1 auStack_68 [48];
  TestAllExtensions local_38;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)auStack_68);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)(auStack_68 + 0x30));
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>((TestAllExtensions *)auStack_68);
  this_00 = proto2_unittest::TestAllExtensions::GetReflection();
  GeneratedMessageReflectionSwapTest::Swap
            ((GeneratedMessageReflectionSwapTest *)this_00,(Reflection *)auStack_68,
             (Message *)(auStack_68 + 0x30),in_RCX);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)auStack_68);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)(auStack_68 + 0x30));
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)(auStack_68 + 0x30));
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)auStack_68);
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, Extensions) {
  unittest::TestAllExtensions lhs;
  unittest::TestAllExtensions rhs;

  TestUtil::SetAllExtensions(&lhs);

  Swap(lhs.GetReflection(), &lhs, &rhs);

  TestUtil::ExpectExtensionsClear(lhs);
  TestUtil::ExpectAllExtensionsSet(rhs);
}